

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ArrayReverseMethod::eval
          (ArrayReverseMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  ConstantValue *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  __reverse_fn *in_RDI;
  ConstantValue *target;
  LValue lval;
  borrowed_iterator_t<std::vector<slang::ConstantValue>_&> in_stack_fffffffffffffdc8;
  EvalContext *in_stack_fffffffffffffdd0;
  Expression *in_stack_fffffffffffffdd8;
  ConstantValue *__r;
  __reverse_fn *this_01;
  SVQueue *in_stack_fffffffffffffe20;
  __reverse_fn *in_stack_fffffffffffffe28;
  
  this_01 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::evalLValue(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  bVar1 = LValue::operator_cast_to_bool((LValue *)0x132e024);
  if (bVar1) {
    this_00 = LValue::resolve((LValue *)this_01);
    if (this_00 == (ConstantValue *)0x0) {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8._M_current);
    }
    else {
      __r = this_00;
      bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0x132e0be);
      if (bVar1) {
        slang::ConstantValue::queue((ConstantValue *)0x132e0ce);
        CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x132e0df);
        std::ranges::__reverse_fn::operator()<slang::SVQueue_&>
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      }
      else {
        slang::ConstantValue::getVariant_abi_cxx11_(this_00);
        in_stack_fffffffffffffdd0 =
             (EvalContext *)
             std::
             get<std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)0x132e109);
        in_stack_fffffffffffffdc8 =
             std::ranges::__reverse_fn::
             operator()<std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_&>
                       (this_01,(vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 *)__r);
      }
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8._M_current);
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8._M_current);
  }
  LValue::~LValue((LValue *)0x132e155);
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        if (!lval)
            return nullptr;

        auto target = lval.resolve();
        if (!target)
            return nullptr;

        if (target->isQueue())
            std::ranges::reverse(*target->queue());
        else
            std::ranges::reverse(std::get<ConstantValue::Elements>(target->getVariant()));

        return nullptr;
    }